

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O3

string * anon_unknown.dwarf_2d5c74::ToCMakePath(string *__return_storage_ptr__,string *path)

{
  pointer pcVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (path->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + path->_M_string_length);
  cmsys::SystemTools::ConvertToUnixSlashes(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string ToCMakePath(const std::string& path)
{
  auto temp = path;
  cmSystemTools::ConvertToUnixSlashes(temp);
  return temp;
}